

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParameterErrorsTest::
GetAttachmentParameterErrorsTest(GetAttachmentParameterErrorsTest *this,Context *context)

{
  Context *context_local;
  GetAttachmentParameterErrorsTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"framebuffers_get_attachment_parameter_errors",
             "Get Attachment Parameter Errors Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetAttachmentParameterErrorsTest_0324e798;
  this->m_fbo_valid = 0;
  this->m_rbo_color = 0;
  this->m_rbo_depth_stencil = 0;
  this->m_fbo_invalid = 0;
  this->m_parameter_invalid = 0;
  this->m_attachment_invalid = 0;
  this->m_default_attachment_invalid = 0;
  this->m_max_color_attachments = 8;
  return;
}

Assistant:

GetAttachmentParameterErrorsTest::GetAttachmentParameterErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "framebuffers_get_attachment_parameter_errors", "Get Attachment Parameter Errors Test")
	, m_fbo_valid(0)
	, m_rbo_color(0)
	, m_rbo_depth_stencil(0)
	, m_fbo_invalid(0)
	, m_parameter_invalid(0)
	, m_attachment_invalid(0)
	, m_default_attachment_invalid(0)
	, m_max_color_attachments(8) /* Spec default. */
{
	/* Intentionally left blank. */
}